

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::Task::~Task(Task *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this->node);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose(&(this->next).ptr);
  kj::_::Event::~Event(&this->super_Event);
  return;
}

Assistant:

Task(_::OwnPromiseNode&& nodeParam, TaskSet& taskSet)
      : Event(taskSet.location), taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }